

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_update_dims_from_array(nifti_image *nim)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (nim == (nifti_image *)0x0) {
    nifti_update_dims_from_array_cold_4();
  }
  else {
    if (2 < g_opts_0) {
      nifti_update_dims_from_array_cold_1();
    }
    uVar4 = nim->dim[0];
    uVar5 = (ulong)uVar4;
    if (0xfffffff8 < uVar4 - 8) {
      iVar1 = nim->dim[1];
      if (iVar1 < 1) {
        nim->dim[1] = 1;
        iVar1 = 1;
      }
      nim->nx = iVar1;
      nim->dx = nim->pixdim[1];
      if ((uVar4 < 2) || (iVar1 = nim->dim[2], iVar1 < 1)) {
        nim->dim[2] = 1;
        iVar1 = 1;
      }
      nim->ny = iVar1;
      nim->dy = nim->pixdim[2];
      if ((uVar4 < 3) || (iVar1 = nim->dim[3], iVar1 < 1)) {
        nim->dim[3] = 1;
        iVar1 = 1;
      }
      nim->nz = iVar1;
      nim->dz = nim->pixdim[3];
      if ((uVar4 < 4) || (iVar1 = nim->dim[4], iVar1 < 1)) {
        nim->dim[4] = 1;
        iVar1 = 1;
      }
      nim->nt = iVar1;
      nim->dt = nim->pixdim[4];
      if ((uVar4 < 5) || (iVar1 = nim->dim[5], iVar1 < 1)) {
        nim->dim[5] = 1;
        iVar1 = 1;
      }
      nim->nu = iVar1;
      nim->du = nim->pixdim[5];
      if ((uVar4 < 6) || (iVar1 = nim->dim[6], iVar1 < 1)) {
        nim->dim[6] = 1;
        iVar1 = 1;
      }
      nim->nv = iVar1;
      nim->dv = nim->pixdim[6];
      if ((uVar4 < 7) || (iVar1 = nim->dim[7], iVar1 < 1)) {
        nim->dim[7] = 1;
        iVar1 = 1;
      }
      nim->nw = iVar1;
      nim->dw = nim->pixdim[7];
      sVar2 = 1;
      uVar3 = 0;
      do {
        sVar2 = sVar2 * (long)nim->dim[uVar3 + 1];
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      nim->nvox = sVar2;
      if (1 < (int)uVar4) {
        do {
          uVar4 = (uint)uVar5;
          if (1 < nim->dim[uVar5]) goto LAB_00106724;
          uVar5 = (ulong)(uVar4 - 1);
        } while (2 < (int)uVar4);
        uVar4 = 1;
      }
LAB_00106724:
      if (2 < g_opts_0) {
        nifti_update_dims_from_array_cold_2();
      }
      nim->ndim = uVar4;
      nim->dim[0] = uVar4;
      return 0;
    }
    nifti_update_dims_from_array_cold_3();
  }
  return 1;
}

Assistant:

int nifti_update_dims_from_array( nifti_image * nim )
{
   int c, ndim;

   if( !nim ){
      fprintf(stderr,"** update_dims: missing nim\n");
      return 1;
   }

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d updating image dimensions given nim->dim:");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
   }

   /* verify dim[0] first */
   if(nim->dim[0] < 1 || nim->dim[0] > 7){
      fprintf(stderr,"** invalid dim[0], dim[] = ");
      for( c = 0; c < 8; c++ ) fprintf(stderr," %d", nim->dim[c]);
      fputc('\n',stderr);
      return 1;
   }

   /* set nx, ny ..., dx, dy, ..., one by one */

   /* less than 1, set to 1, else copy */
   if(nim->dim[1] < 1) nim->nx = nim->dim[1] = 1;
   else                nim->nx = nim->dim[1];
   nim->dx = nim->pixdim[1];

   /* if undefined, or less than 1, set to 1 */
   if(nim->dim[0] < 2 || (nim->dim[0] >= 2 && nim->dim[2] < 1))
      nim->ny = nim->dim[2] = 1;
   else
      nim->ny = nim->dim[2];
   /* copy delta values, in any case */
   nim->dy = nim->pixdim[2];

   if(nim->dim[0] < 3 || (nim->dim[0] >= 3 && nim->dim[3] < 1))
      nim->nz = nim->dim[3] = 1;
   else /* just copy vals from arrays */
      nim->nz = nim->dim[3];
   nim->dz = nim->pixdim[3];

   if(nim->dim[0] < 4 || (nim->dim[0] >= 4 && nim->dim[4] < 1))
      nim->nt = nim->dim[4] = 1;
   else /* just copy vals from arrays */
      nim->nt = nim->dim[4];
   nim->dt = nim->pixdim[4];

   if(nim->dim[0] < 5 || (nim->dim[0] >= 5 && nim->dim[5] < 1))
      nim->nu = nim->dim[5] = 1;
   else /* just copy vals from arrays */
      nim->nu = nim->dim[5];
   nim->du = nim->pixdim[5];

   if(nim->dim[0] < 6 || (nim->dim[0] >= 6 && nim->dim[6] < 1))
      nim->nv = nim->dim[6] = 1;
   else /* just copy vals from arrays */
      nim->nv = nim->dim[6];
   nim->dv = nim->pixdim[6];

   if(nim->dim[0] < 7 || (nim->dim[0] >= 7 && nim->dim[7] < 1))
      nim->nw = nim->dim[7] = 1;
   else /* just copy vals from arrays */
      nim->nw = nim->dim[7];
   nim->dw = nim->pixdim[7];

   for( c = 1, nim->nvox = 1; c <= nim->dim[0]; c++ )
      nim->nvox *= nim->dim[c];

   /* compute ndim, assuming it can be no larger than the old one */
   for( ndim = nim->dim[0]; (ndim > 1) && (nim->dim[ndim] <= 1); ndim-- )
       ;

   if( g_opts.debug > 2 ){
      fprintf(stderr,"+d ndim = %d -> %d\n",nim->ndim, ndim);
      fprintf(stderr," --> (%d,%d,%d,%d,%d,%d,%d)\n",
              nim->nx, nim->ny, nim->nz, nim->nt, nim->nu, nim->nv, nim->nw);
   }

   nim->dim[0] = nim->ndim = ndim;

   return 0;
}